

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O1

LTFlightData * __thiscall ACTable::build(ACTable *this,string *_filter,int _x,int _y)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  pointer pcVar3;
  bool bVar4;
  ImU32 col_00;
  ImU32 col_01;
  ImGuiTableSortSpecs *pIVar5;
  ACIWnd *pAVar6;
  ImGuiContext *ctx;
  pointer __k;
  ImGuiTableColumnFlags *pIVar7;
  AlignTy *pAVar8;
  LTAircraft *this_00;
  string *psVar9;
  string *s;
  _Base_ptr *pp_Var10;
  ImGuiID col;
  long lVar11;
  ImVec2 IVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  bool bVisible;
  bool bAutoVisible;
  ImVec2 selSize;
  string url;
  ImVec2 tblSize;
  bool local_a2;
  bool local_a1;
  ImVec2 local_a0;
  string local_98;
  string local_78;
  _Base_ptr local_58;
  string *local_50;
  pointer local_48;
  _Base_ptr local_40;
  ImVec2 local_38;
  
  IVar12 = ImGui::GetContentRegionAvail();
  auVar13._4_4_ = 0;
  auVar13._0_4_ = _x;
  auVar13._8_4_ = _y;
  auVar13._12_4_ = 0;
  uVar14 = CONCAT44(-(uint)(0 < _y),-(uint)(0 < _x));
  local_38 = (ImVec2)(CONCAT44((float)(SUB168(auVar13 | _DAT_002494c0,8) - DAT_002494c0._8_8_),
                               (float)(SUB168(auVar13 | _DAT_002494c0,0) - (double)DAT_002494c0)) &
                      uVar14 | ~uVar14 & CONCAT44((float)_y + IVar12.y,(float)_x + IVar12.x));
  bVar4 = ImGui::BeginTable("ACList",0x27,0x170804f,&local_38,0.0);
  if (bVar4) {
    pIVar7 = &gCols._M_elems[0].colFlags;
    lVar11 = 0;
    do {
      ImGui::TableSetupColumn
                ((((ACTColDefTy *)(pIVar7 + -10))->colName)._M_dataplus._M_p,*pIVar7 | 0x800,
                 (float)pIVar7[-2],(ImGuiID)lVar11);
      lVar11 = lVar11 + 1;
      pIVar7 = pIVar7 + 0xc;
    } while (lVar11 != 0x27);
    ImGui::TableAutoHeaders();
    bVar4 = UpdateFDIs(this,_filter);
    pIVar5 = ImGui::TableGetSortSpecs();
    if ((bVar4) ||
       ((((pIVar5 != (ImGuiTableSortSpecs *)0x0 && (pIVar5->SpecsChanged == true)) &&
         (pIVar5->Specs != (ImGuiTableSortSpecsColumn *)0x0)) &&
        ((0 < pIVar5->SpecsCount &&
         (1 < (ulong)(((long)(this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4) * 0x2fd2fd2fd2fd2fd3))))
        ))) {
      Sort(this,*(ACTColumnsTy *)pIVar5->Specs,pIVar5->Specs[6] == (ImGuiTableSortSpecsColumn)0x1);
    }
    __k = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
          super__Vector_impl_data._M_start;
    local_48 = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (__k != local_48) {
      psVar9 = (__k->v)._M_elems;
      local_58 = &mapFd._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        ImGui::TableNextRow(0,0.0);
        pAVar8 = &gCols._M_elems[0].colAlign;
        lVar11 = 0;
        s = psVar9;
        do {
          if (((lVar11 != 0xe) && (lVar11 != 0x26)) &&
             (bVar4 = ImGui::TableSetColumnIndex((int)lVar11), bVar4)) {
            ImGui::TextAligned(*pAVar8,s);
          }
          lVar11 = lVar11 + 1;
          s = s + 1;
          pAVar8 = pAVar8 + 0xc;
        } while (lVar11 != 0x27);
        ImGui::PushID((__k->key).key._M_dataplus._M_p);
        col_00 = ImGui::GetColorU32(0x18,1.0);
        col_01 = ImGui::GetColorU32(0x19,1.0);
        ImGui::PushStyleColor(0x18,col_01);
        ImGui::PushStyleColor(0x19,col_00);
        local_a0.x = ImGui::GetWidthIconBtn(false);
        local_a0.y = 0.0;
        local_40 = (_Base_ptr)
                   std::
                   _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                   ::find(&mapFd._M_t,&__k->key);
        pp_Var10 = &local_40[2]._M_left;
        this_00 = (LTAircraft *)0x0;
        if (local_40 == local_58) {
          pp_Var10 = (_Base_ptr *)0x0;
        }
        else {
          this_00 = (LTAircraft *)local_40[0x1d]._M_left;
        }
        bVar4 = ImGui::TableSetColumnIndex(0xe);
        paVar1 = &local_98.field_2;
        if (bVar4) {
          bVar4 = ImGui::SelectableTooltip
                            (anon_var_dwarf_1fc81,false,(__k->key).eKeyType == KEY_ICAO,
                             "Update aircraft profile at OpenSky",0,&local_a0);
          if (bVar4) {
            local_98._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"https://opensky-network.org/aircraft-profile?icao24=",""
                      );
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            pcVar3 = (__k->key).key._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,pcVar3,pcVar3 + (__k->key).key._M_string_length);
            LTOpenURL(&local_98,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar1) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
          ImGui::SameLine(0.0,-1.0);
          bVar4 = ImGui::SelectableTooltip
                            (anon_var_dwarf_1fcc9,false,(__k->v)._M_elems[10]._M_string_length != 0,
                             "Update flight/route at OpenSky",0,&local_a0);
          if (bVar4) {
            local_98._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"https://opensky-network.org/add-route?callsign=","");
            LTOpenURL(&local_98,(__k->v)._M_elems + 10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar1) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
        }
        bVar4 = ImGui::TableSetColumnIndex(0x26);
        if (bVar4) {
          if (this_00 == (LTAircraft *)0x0) {
            local_a2 = false;
            local_a1 = false;
          }
          else {
            local_a2 = false;
            if ((this_00->super_Aircraft).bVisible != false) {
              uVar2 = (this_00->super_Aircraft).bValid;
              local_a2 = (bool)uVar2;
            }
            local_a1 = this_00->bAutoVisible;
          }
          pAVar6 = ACIWnd::GetWnd(&__k->key);
          bVar4 = ImGui::SelectableTooltip
                            (anon_var_dwarf_1fd11,pAVar6 != (ACIWnd *)0x0,true,
                             "Open Aircraft Info Window",0,&local_a0);
          if (bVar4) {
            ctx = ImGui::GetCurrentContext();
            if (pAVar6 == (ACIWnd *)0x0) {
              pcVar3 = (__k->key).key._M_dataplus._M_p;
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              local_50 = psVar9;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar3,pcVar3 + (__k->key).key._M_string_length);
              ACIWnd::OpenNewWnd(&local_98,WND_MODE_FLOAT_CNT_VR);
              psVar9 = local_50;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
                psVar9 = local_50;
              }
            }
            else {
              (*(pAVar6->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])(pAVar6);
            }
            ImGui::SetCurrentContext(ctx);
          }
          ImGui::SameLine(0.0,-1.0);
          bVar4 = ImGui::SelectableTooltip
                            (anon_var_dwarf_1fd41,
                             LTAircraft::pExtViewAc == this_00 && this_00 != (LTAircraft *)0x0,
                             this_00 != (LTAircraft *)0x0,"Toggle camera view",0,&local_a0);
          if (bVar4) {
            LTAircraft::ToggleCameraView(this_00);
          }
          ImGui::SameLine(0.0,-1.0);
          paVar1 = &local_98.field_2;
          local_98._M_dataplus._M_p = (pointer)paVar1;
          if (local_40 == local_58) {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98);
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pp_Var10[0x5f],
                       (long)pp_Var10[0x60] + (long)pp_Var10[0x5f]);
          }
          bVar4 = ImGui::SelectableTooltip
                            (anon_var_dwarf_4fc7,false,local_98._M_string_length != 0,
                             "Open flight in browser",0,&local_a0);
          if (bVar4) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
            LTOpenURL(&local_98,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
          ImGui::SameLine(0.0,-1.0);
          bVar4 = ImGui::SelectableTooltip
                            (anon_var_dwarf_1fdad,&local_a2,this_00 != (LTAircraft *)0x0,
                             "Toggle aircraft\'s visibility",0,&local_a0);
          if (bVar4) {
            (*(this_00->super_Aircraft)._vptr_Aircraft[4])(this_00,(ulong)local_a2);
          }
          if ((dataRefs.hideStaticTwr != 0) || (bVar4 = DataRefs::WarnAutoHiding(&dataRefs), bVar4))
          {
            ImGui::SameLine(0.0,-1.0);
            bVar4 = ImGui::SelectableTooltip
                              (anon_var_dwarf_1fdd1,&local_a1,this_00 != (LTAircraft *)0x0,
                               "Toggle aircraft\'s auto visibility",0,&local_a0);
            if (bVar4) {
              LTAircraft::SetAutoVisible(this_00,local_a1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        ImGui::PopStyleColor(2);
        ImGui::PopID();
        __k = __k + 1;
        psVar9 = (string *)&psVar9[0x2d].field_2;
      } while (__k != local_48);
    }
    ImGui::EndTable();
  }
  return (LTFlightData *)0x0;
}

Assistant:

LTFlightData* ACTable::build (const std::string& _filter, int _x, int _y)
{
    // return value: the just selected aircraft, if any
    LTFlightData* pSelFD = nullptr;
    
    // Determine size, basis is the available content region
    ImVec2 tblSize = ImGui::GetContentRegionAvail();
    if (_x <= 0) tblSize.x += float(_x);    // Determine width
    else tblSize.x = float(_x);
    if (_y <= 0) tblSize.y += float(_y);    // Determine height
    else tblSize.y = float(_y);
    
    // Start drawing the table
    if (ImGui::BeginTable("ACList", ACT_COL_COUNT,
                          ImGuiTableFlags_Resizable | ImGuiTableFlags_Reorderable |
                          ImGuiTableFlags_Hideable | ImGuiTableFlags_Sortable |
                          ImGuiTableFlags_RowBg |
                          ImGuiTableFlags_SizingPolicyFixedX | ImGuiTableFlags_Scroll |
                          ImGuiTableFlags_ScrollFreezeTopRow |
                          ImGuiTableFlags_ScrollFreezeLeftColumn,
                          tblSize))
    {
        // Set up the columns
        for (ImGuiID col = 0; col < ACT_COL_COUNT; ++col) {
            const ACTColDefTy& colDef = gCols[col];
            ImGui::TableSetupColumn(colDef.colName.c_str(),
                                    colDef.colFlags | ImGuiTableColumnFlags_NoHeaderWidth,
                                    colDef.colWidth,
                                    col);       // use ACTColumnsTy as ColumnUserID
        }
        ImGui::TableAutoHeaders();

        // Set up a/c list
        bool bUpdated = UpdateFDIs(_filter);

        // Sort the data if and as needed
        const ImGuiTableSortSpecs* sortSpecs = ImGui::TableGetSortSpecs();
        if (bUpdated ||
            (sortSpecs && sortSpecs->SpecsChanged &&
             sortSpecs->Specs && sortSpecs->SpecsCount >= 1 &&
             vecFDI.size() > 1))
        {
            // We sort only by one column, no multi-column sort yet
            const ImGuiTableSortSpecsColumn& colSpec = *(sortSpecs->Specs);
            Sort((ACTColumnsTy)colSpec.ColumnUserID,
                 colSpec.SortDirection == ImGuiSortDirection_Ascending);
        }
        
        // Fill the data into the list
        for (const FDInfo& fdi: vecFDI) {
            ImGui::TableNextRow();
            for (size_t col = 0; col < ACT_COL_COUNT; ++col) {
                switch (col) {
                    // There are a few columns with special treatment,
                    case ACT_COL_UPDATE:
                    case ACT_COL_ACTIONS:
                        continue;
                     // the others are just to be drawn
                    default:
                        if (ImGui::TableSetColumnIndex(int(col))) {
                            ImGui::TextAligned(gCols[col].colAlign, fdi.v[col]);
                        }
                }
            }
            
            // --- prepare for columns with action buttons ---
            
            // Make sure all the buttons have a unique id
            ImGui::PushID(fdi.key.c_str());
            
            // Make selected buttons more visible: Exchange Hovered (lighter) and std color (darker)
            const ImU32 colHeader = ImGui::GetColorU32(ImGuiCol_Header);
            ImGui::PushStyleColor(ImGuiCol_Header,          ImGui::GetColorU32(ImGuiCol_HeaderHovered));
            ImGui::PushStyleColor(ImGuiCol_HeaderHovered,   colHeader);
            
            // Limit the width of the selectables
            ImVec2 selSize (ImGui::GetWidthIconBtn(), 0.0f);
            
            // (Potential) access to the aircraft, can be `nullptr`!
            LTFlightData* pFD = fdi.GetFD();
            LTAircraft* pAc = pFD ? pFD->GetAircraft() : nullptr;
            
            // Update columnd
            if (ImGui::TableSetColumnIndex(ACT_COL_UPDATE)) {
                // Aircraft Profile update (if there is an ICAO key)
                if (ImGui::SelectableTooltip(ICON_FA_PLANE "##AircraftProfile",
                                             false,                                         // selected?
                                             fdi.key.eKeyType == LTFlightData::KEY_ICAO,    // enabled?
                                             "Update aircraft profile at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_AC, fdi.key);
                
                // Route update (if there is a call sign)
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_ROUTE "##Route",
                                             false,                                         // selected?
                                             !fdi.v[ACT_COL_CALLSIGN].empty(),              // enabled?
                                             "Update flight/route at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_ROUTE, fdi.v[ACT_COL_CALLSIGN]);
            }

            // Action column
            if (ImGui::TableSetColumnIndex(ACT_COL_ACTIONS)) {
                // Is a/c visible/auto-visible?
                bool bVisible       = pAc ? pAc->IsVisible()        : false;
                bool bAutoVisible   = pAc ? pAc->IsAutoVisible()    : false;

                // Open a/c info window
                ACIWnd* pACIWnd = ACIWnd::GetWnd(fdi.key);
                if (ImGui::SelectableTooltip(ICON_FA_INFO_CIRCLE "##ACIWnd",
                                             pACIWnd != nullptr, true,              // selected?, enabled!
                                             "Open Aircraft Info Window",
                                             ImGuiSelectableFlags_None, selSize))
                {
                    // Toggle a/c info wnd (safe/restore our context as we are now dealing with another ImGui window,
                    // which can mess up context pointers)
                    ImGuiContext* pCtxt = ImGui::GetCurrentContext();
                    if (pACIWnd) {
                        delete pACIWnd;
                        pACIWnd = nullptr;
                    } else {
                        ACIWnd::OpenNewWnd(fdi.key);
                    }
                    ImGui::SetCurrentContext(pCtxt);

                    // Open an ACIWnd, which is another ImGui window, so safe/restore our context
                }

                // Camera view
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_CAMERA "##CameraView",
                                             pAc ? pAc->IsInCameraView() : false,   // selected?
                                             pAc != nullptr,                        // enabled?
                                             "Toggle camera view",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->ToggleCameraView();

                // Link to browser for following the flight
                ImGui::SameLine();
                const std::string url (pFD ? pFD->GetUnsafeStat().slug : "");
                if (ImGui::SelectableTooltip(ICON_FA_EXTERNAL_LINK_SQUARE_ALT "##FlightURL",
                                             false,                                 // selected?
                                             !url.empty(),                          // enabled?
                                             "Open flight in browser",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(url);
                
                // Visible
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_EYE "##Visible", &bVisible,
                                             pAc != nullptr,      // enabled/disabled?
                                             "Toggle aircraft's visibility",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->SetVisible(bVisible);

                // "Auto Visible" only if some auto-hiding option is on
                if (dataRefs.IsAutoHidingActive()) {
                    ImGui::SameLine();
                    if (ImGui::SelectableTooltip(ICON_FA_EYE "##AutoVisible", &bAutoVisible,
                                                 pAc != nullptr,  // enabled/disabled
                                                 "Toggle aircraft's auto visibility",
                                                 ImGuiSelectableFlags_None, selSize))
                        pAc->SetAutoVisible(bAutoVisible);
                }
            } // action column

            // Restore styles
            ImGui::PopStyleColor(2);
            ImGui::PopID();

        }   // for all a/c rows
        
        // End of aircraft list
        ImGui::EndTable();
    }
    
    // return value: the just selected aircraft, if any
    return pSelFD;
}